

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

float lapv(qnode_ptr_t p,int x,int y)

{
  int iVar1;
  disp_field512_t *padVar2;
  long lVar3;
  long lVar4;
  
  padVar2 = p->flow_ptr;
  iVar1 = p->res;
  lVar3 = (long)((x + -1) * iVar1 + y);
  lVar4 = (long)((x + 1) * iVar1 + y);
  return ((*padVar2)[lVar3].y + (*padVar2)[lVar4].y + (*padVar2)[iVar1 * x + y + -1].y +
         (*padVar2)[iVar1 * x + 1 + y].y) * 0.16666667 +
         (padVar2[-1][lVar3 + 0x1860f].y + (*padVar2)[lVar3 + 1].y + padVar2[-1][lVar4 + 0x1860f].y
         + (*padVar2)[lVar4 + 1].y) * 0.083333336;
}

Assistant:

float lapv(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ float d ;

  d = (1.0/6.0)*((*p->flow_ptr)[p->res*(x-1) + y].y +
  (*p->flow_ptr)[p->res*(x+1) + y].y +
  (*p->flow_ptr)[p->res*x + (y-1)].y +
  (*p->flow_ptr)[p->res*x + (y+1)].y) +
  (1.0/12.0)*((*p->flow_ptr)[p->res*(x-1) + y-1].y +
  (*p->flow_ptr)[p->res*(x-1) + y+1].y +
  (*p->flow_ptr)[p->res*(x+1) + y-1].y +
  (*p->flow_ptr)[p->res*(x+1) + y+1].y) ;
  return(d) ;
}